

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_Equal3_Test<unsigned_short>::TestBody(SparseArray_Equal3_Test<unsigned_short> *this)

{
  bool bVar1;
  type lhs;
  type rhs;
  char *message;
  char *in_R9;
  initializer_list<std::pair<unsigned_long,_int>_> v;
  initializer_list<std::pair<unsigned_long,_int>_> v_00;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_c0 [2];
  pair<unsigned_long,_int> local_b8;
  pair<unsigned_long,_int> local_a8;
  pair<unsigned_long,_int> local_98;
  pair<unsigned_long,_int> *local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  arr2;
  int local_68 [4];
  pair<unsigned_long,_int> local_58;
  pair<unsigned_long,_int> local_48;
  pair<unsigned_long,_int> local_38;
  pair<unsigned_long,_int> *local_28;
  undefined8 local_20;
  undefined1 local_18 [8];
  unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  arr1;
  SparseArray_Equal3_Test<unsigned_short> *this_local;
  
  local_68[3] = 0;
  local_68[2] = 1;
  arr1._M_t.
  super___uniq_ptr_impl<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<int,_unsigned_short>_*,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  .super__Head_base<0UL,_pstore::sparse_array<int,_unsigned_short>_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>,_true,_true>
        )(__uniq_ptr_data<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>,_true,_true>
          )this;
  std::pair<unsigned_long,_int>::pair<int,_int,_true>(&local_58,local_68 + 3,local_68 + 2);
  local_68[1] = 2;
  local_68[0] = 2;
  std::pair<unsigned_long,_int>::pair<int,_int,_true>(&local_48,local_68 + 1,local_68);
  arr2._M_t.
  super___uniq_ptr_impl<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<int,_unsigned_short>_*,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  .super__Head_base<0UL,_pstore::sparse_array<int,_unsigned_short>_*,_false>._M_head_impl._4_4_ = 5;
  arr2._M_t.
  super___uniq_ptr_impl<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<int,_unsigned_short>_*,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  .super__Head_base<0UL,_pstore::sparse_array<int,_unsigned_short>_*,_false>._M_head_impl._0_4_ = 4;
  std::pair<unsigned_long,_int>::pair<int,_int,_true>
            (&local_38,
             (int *)((long)&arr2._M_t.
                            super___uniq_ptr_impl<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::sparse_array<int,_unsigned_short>_*,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
                            .
                            super__Head_base<0UL,_pstore::sparse_array<int,_unsigned_short>_*,_false>
                            ._M_head_impl + 4),(int *)&arr2);
  local_20 = 3;
  v._M_len = (size_type)&local_58;
  v._M_array = (iterator)local_18;
  local_28 = &local_58;
  pstore::sparse_array<int,_unsigned_short>::make_unique(v);
  local_c0[1] = 0;
  local_c0[0] = 0;
  std::pair<unsigned_long,_int>::pair<int,_int,_true>(&local_b8,local_c0 + 1,local_c0);
  local_d0 = 2;
  local_d4 = 2;
  std::pair<unsigned_long,_int>::pair<int,_int,_true>
            (&local_a8,&stack0xffffffffffffff30,&stack0xffffffffffffff2c);
  local_d8 = 4;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 4;
  std::pair<unsigned_long,_int>::pair<int,_int,_true>
            (&local_98,&stack0xffffffffffffff28,
             (int *)((long)&gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_88 = &local_b8;
  local_80 = 3;
  v_00._M_len = (size_type)local_88;
  v_00._M_array = (iterator)local_78;
  pstore::sparse_array<int,_unsigned_short>::make_unique(v_00);
  lhs = std::
        unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
        ::operator*((unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
                     *)local_18);
  rhs = std::
        unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
        ::operator*((unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
                     *)local_78);
  bVar1 = pstore::operator==(lhs,rhs);
  local_f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_f0,(AssertionResult *)"*arr1 == *arr2","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x103,message);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::
  unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  ::~unique_ptr((unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
                 *)local_78);
  std::
  unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
  ::~unique_ptr((unique_ptr<pstore::sparse_array<int,_unsigned_short>,_std::default_delete<pstore::sparse_array<int,_unsigned_short>_>_>
                 *)local_18);
  return;
}

Assistant:

TYPED_TEST (SparseArray, Equal3) {
    auto arr1 = sparse_array<int, TypeParam>::make_unique ({{0, 1}, {2, 2}, {5, 4}});
    auto arr2 = sparse_array<int, TypeParam>::make_unique ({{0, 0}, {2, 2}, {4, 4}});
    EXPECT_FALSE (*arr1 == *arr2);
}